

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_squares_i16_sse2(int16_t *src,uint32_t n)

{
  uint64_t uVar1;
  uint in_ESI;
  int16_t *in_RDI;
  uint32_t k;
  uint32_t in_stack_00000184;
  int16_t *in_stack_00000188;
  uint64_t local_8;
  
  if ((in_ESI & 0x3f) == 0) {
    local_8 = aom_sum_squares_i16_64n_sse2(in_stack_00000188,in_stack_00000184);
  }
  else if (in_ESI < 0x41) {
    local_8 = aom_sum_squares_i16_c(in_RDI,in_ESI);
  }
  else {
    local_8 = aom_sum_squares_i16_64n_sse2(in_stack_00000188,in_stack_00000184);
    uVar1 = aom_sum_squares_i16_c(in_RDI + (in_ESI & 0xffffffc0),in_ESI - (in_ESI & 0xffffffc0));
    local_8 = local_8 + uVar1;
  }
  return local_8;
}

Assistant:

uint64_t aom_sum_squares_i16_sse2(const int16_t *src, uint32_t n) {
  if (n % 64 == 0) {
    return aom_sum_squares_i16_64n_sse2(src, n);
  } else if (n > 64) {
    const uint32_t k = n & ~63u;
    return aom_sum_squares_i16_64n_sse2(src, k) +
           aom_sum_squares_i16_c(src + k, n - k);
  } else {
    return aom_sum_squares_i16_c(src, n);
  }
}